

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_sbit_decoder_alloc_bitmap(TT_SBitDecoder decoder,FT_Bool metrics_only)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  FT_Bitmap *pFVar4;
  unsigned_short uVar5;
  FT_Error FVar6;
  uint uVar7;
  uint uVar8;
  FT_ULong size;
  
  if (decoder->metrics_loaded == '\0') {
    return 6;
  }
  pFVar4 = decoder->bitmap;
  uVar2 = decoder->metrics->width;
  uVar8 = (uint)uVar2;
  uVar3 = decoder->metrics->height;
  pFVar4->width = (uint)uVar2;
  pFVar4->rows = (uint)uVar3;
  bVar1 = decoder->bit_depth;
  if (bVar1 - 1 < 8) {
    uVar7 = (uint)uVar2;
    FVar6 = 3;
    switch((uint)bVar1) {
    case 1:
      pFVar4->pixel_mode = '\x01';
      uVar8 = uVar7 + 7 >> 3;
      uVar5 = 2;
      break;
    case 2:
      pFVar4->pixel_mode = '\x03';
      uVar8 = uVar7 + 3 >> 2;
      uVar5 = 4;
      break;
    default:
      goto switchD_0021fc52_caseD_3;
    case 4:
      pFVar4->pixel_mode = '\x04';
      uVar8 = uVar7 + 1 >> 1;
      uVar5 = 0x10;
      break;
    case 8:
      pFVar4->pixel_mode = '\x02';
      goto LAB_0021fc8d;
    }
  }
  else {
    if (bVar1 != 0x20) {
      return 3;
    }
    pFVar4->pixel_mode = '\a';
    uVar8 = (uint)uVar2 << 2;
LAB_0021fc8d:
    uVar5 = 0x100;
  }
  pFVar4->pitch = uVar8;
  pFVar4->num_grays = uVar5;
  FVar6 = 0;
  if (((metrics_only == '\0') && (size = (ulong)uVar8 * (ulong)uVar3, FVar6 = 0, size != 0)) &&
     (FVar6 = ft_glyphslot_alloc_bitmap((decoder->face->root).glyph,size), FVar6 == 0)) {
    decoder->bitmap_allocated = '\x01';
    FVar6 = 0;
  }
switchD_0021fc52_caseD_3:
  return FVar6;
}

Assistant:

static FT_Error
  tt_sbit_decoder_alloc_bitmap( TT_SBitDecoder  decoder,
                                FT_Bool         metrics_only )
  {
    FT_Error    error = FT_Err_Ok;
    FT_UInt     width, height;
    FT_Bitmap*  map = decoder->bitmap;
    FT_ULong    size;


    if ( !decoder->metrics_loaded )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    width  = decoder->metrics->width;
    height = decoder->metrics->height;

    map->width = width;
    map->rows  = height;

    switch ( decoder->bit_depth )
    {
    case 1:
      map->pixel_mode = FT_PIXEL_MODE_MONO;
      map->pitch      = (int)( ( map->width + 7 ) >> 3 );
      map->num_grays  = 2;
      break;

    case 2:
      map->pixel_mode = FT_PIXEL_MODE_GRAY2;
      map->pitch      = (int)( ( map->width + 3 ) >> 2 );
      map->num_grays  = 4;
      break;

    case 4:
      map->pixel_mode = FT_PIXEL_MODE_GRAY4;
      map->pitch      = (int)( ( map->width + 1 ) >> 1 );
      map->num_grays  = 16;
      break;

    case 8:
      map->pixel_mode = FT_PIXEL_MODE_GRAY;
      map->pitch      = (int)( map->width );
      map->num_grays  = 256;
      break;

    case 32:
      map->pixel_mode = FT_PIXEL_MODE_BGRA;
      map->pitch      = (int)( map->width * 4 );
      map->num_grays  = 256;
      break;

    default:
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    size = map->rows * (FT_ULong)map->pitch;

    /* check that there is no empty image */
    if ( size == 0 )
      goto Exit;     /* exit successfully! */

    if ( metrics_only )
      goto Exit;     /* only metrics are requested */

    error = ft_glyphslot_alloc_bitmap( decoder->face->root.glyph, size );
    if ( error )
      goto Exit;

    decoder->bitmap_allocated = 1;

  Exit:
    return error;
  }